

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

pair<QHostAddress,_int> __thiscall QHostAddress::parseSubnet(QHostAddress *this,QString *subnet)

{
  undefined1 auVar1 [16];
  QHostAddress QVar2;
  bool bVar3;
  bool bVar4;
  uint start;
  uint uVar5;
  uint uVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  int end;
  undefined8 extraout_RDX;
  int i;
  undefined1 *puVar9;
  long lVar10;
  uint uVar11;
  quint32 ip4Addr;
  long in_FS_OFFSET;
  pair<QHostAddress,_int> pVar12;
  QHostAddress mask;
  QStringView local_78;
  undefined1 *local_68;
  bool ok;
  QStringView local_58;
  QHostAddress local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QHostAddress((QHostAddress *)&local_78);
  local_48.d.d.ptr =
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)local_78.m_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_78.m_data;
  local_78 = (QStringView)(auVar1 << 0x40);
  local_40 = (undefined1 *)CONCAT44(local_40._4_4_,0xffffffff);
  ~QHostAddress((QHostAddress *)&local_78);
  if ((subnet->d).size != 0) {
    qVar7 = QString::indexOf(subnet,(QChar)0x2f,0,CaseSensitive);
    local_58.m_data = (subnet->d).ptr;
    local_58.m_size = (subnet->d).size;
    if (qVar7 != -1) {
      local_58.m_size = qVar7;
    }
    bVar3 = QStringView::contains(&local_58,(QChar)0x3a,CaseSensitive);
    if (qVar7 == -1) {
      if (!bVar3) {
LAB_001a0d20:
        start = 0xffffffff;
LAB_001a0d8f:
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_78.m_data._0_4_ = 0xaaaaaaaa;
        local_78.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.m_data._4_4_ = 0xaaaaaaaa;
        QStringView::split(&local_78,&local_58,0x2e,0,1);
        if (local_68 + -5 < (undefined1 *)0xfffffffffffffffc) {
LAB_001a0dc7:
          QHostAddress(this,&local_48);
          *(uint *)&this[1].d.d.ptr = (uint)local_40;
        }
        else {
          if (((QStringView *)((long)local_78.m_data + (local_68 + -1) * 0x10))->m_size == 0) {
            QList<QStringView>::removeLast((QList<QStringView> *)&local_78);
          }
          lVar10 = 0;
          uVar11 = 0;
          for (puVar9 = (undefined1 *)0x0; puVar9 < local_68; puVar9 = puVar9 + 1) {
            mask.d.d.ptr._0_1_ = 0xaa;
            uVar5 = QStringView::toUInt((QStringView *)((long)(qsizetype *)local_78.m_data + lVar10)
                                        ,(bool *)&mask,10);
            if ((0xff < uVar5) || ((char)mask.d.d.ptr == '\0')) goto LAB_001a0dc7;
            uVar11 = uVar11 << 8 | uVar5;
            lVar10 = lVar10 + 0x10;
          }
          uVar6 = (int)local_68 << 3;
          ip4Addr = uVar11 << (-(char)uVar6 & 0x1fU);
          uVar5 = start;
          if (start != 0x20) {
            if (start == 0) {
              ip4Addr = 0;
            }
            else {
              uVar5 = uVar6;
              if (start != 0xffffffff) {
                ip4Addr = (ip4Addr >> (-(char)start & 0x1fU)) << (-(char)start & 0x1fU);
                uVar5 = start;
              }
            }
          }
          QHostAddress(&mask,ip4Addr);
          QVar2 = mask;
          mask.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)
                         (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0;
          (this->d).d.ptr = (QHostAddressPrivate *)QVar2;
          *(uint *)&this[1].d.d.ptr = uVar5;
          ~QHostAddress(&mask);
        }
        QArrayDataPointer<QStringView>::~QArrayDataPointer
                  ((QArrayDataPointer<QStringView> *)&local_78);
        goto LAB_001a0eb1;
      }
LAB_001a0cbe:
      start = 0x80;
LAB_001a0cc3:
      mask.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QHostAddress(&mask);
      QStringView::toString((QString *)&local_78,&local_58);
      bVar3 = setAddress(&mask,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      if (bVar3) {
        clearBits((quint8 *)((long)mask.d.d.ptr + 0x20),start,end);
        QHostAddress(this,&mask);
      }
      else {
        QHostAddress(this,&local_48);
        start = (uint)local_40;
      }
      *(uint *)&this[1].d.d.ptr = start;
LAB_001a0d55:
      ~QHostAddress(&mask);
      goto LAB_001a0eb1;
    }
    if ((bVar3) ||
       (qVar8 = QString::indexOf(subnet,(QChar)0x2e,qVar7 + 1,CaseSensitive), qVar8 == -1)) {
      ok = true;
      mask.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)(subnet->d).size;
      local_78 = QStringView::mid((QStringView *)&mask,qVar7 + 1,-1);
      start = QStringView::toUInt(&local_78,&ok,10);
      if (ok != false) {
        if (!bVar3) goto LAB_001a0d6e;
        if ((int)start < 0x81) {
          if ((int)start < 0) goto LAB_001a0cbe;
          goto LAB_001a0cc3;
        }
      }
    }
    else {
      mask.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QHostAddress(&mask);
      ok = true;
      QString::mid((longlong)&local_78,(longlong)subnet);
      bVar3 = setAddress(&mask,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      if ((!bVar3) || (bVar4 = QNetmask::setAddress((QNetmask *)&ok,&mask), bVar3 = ok, !bVar4)) {
        QHostAddress(this,&local_48);
        *(uint *)&this[1].d.d.ptr = (uint)local_40;
        goto LAB_001a0d55;
      }
      start = (uint)ok;
      ~QHostAddress(&mask);
      if (bVar3 == true) goto LAB_001a0d20;
LAB_001a0d6e:
      if ((int)start < 0x21) goto LAB_001a0d8f;
    }
  }
  QHostAddress(this,&local_48);
  *(uint *)&this[1].d.d.ptr = (uint)local_40;
LAB_001a0eb1:
  ~QHostAddress(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  pVar12._8_8_ = extraout_RDX;
  pVar12.first.d.d.ptr =
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)this;
  return pVar12;
}

Assistant:

std::pair<QHostAddress, int> QHostAddress::parseSubnet(const QString &subnet)
{
    // We support subnets in the form:
    //   ddd.ddd.ddd.ddd/nn
    //   ddd.ddd.ddd/nn
    //   ddd.ddd/nn
    //   ddd/nn
    //   ddd.ddd.ddd.
    //   ddd.ddd.ddd
    //   ddd.ddd.
    //   ddd.ddd
    //   ddd.
    //   ddd
    //   <ipv6-address>/nn
    //
    //  where nn can be an IPv4-style netmask for the IPv4 forms

    const std::pair<QHostAddress, int> invalid = std::pair(QHostAddress(), -1);
    if (subnet.isEmpty())
        return invalid;

    qsizetype slash = subnet.indexOf(u'/');
    QStringView netStr(subnet);
    if (slash != -1)
        netStr.truncate(slash);

    int netmask = -1;
    bool isIpv6 = netStr.contains(u':');

    if (slash != -1) {
        // is the netmask given in IP-form or in bit-count form?
        if (!isIpv6 && subnet.indexOf(u'.', slash + 1) != -1) {
            // IP-style, convert it to bit-count form
            QHostAddress mask;
            QNetmask parser;
            if (!mask.setAddress(subnet.mid(slash + 1)))
                return invalid;
            if (!parser.setAddress(mask))
                return invalid;
            netmask = parser.prefixLength();
        } else {
            bool ok;
            netmask = QStringView{subnet}.mid(slash + 1).toUInt(&ok);
            if (!ok)
                return invalid;     // failed to parse the subnet
        }
    }

    if (isIpv6) {
        // looks like it's an IPv6 address
        if (netmask > 128)
            return invalid;     // invalid netmask
        if (netmask < 0)
            netmask = 128;

        QHostAddress net;
        if (!net.setAddress(netStr.toString()))
            return invalid;     // failed to parse the IP

        clearBits(net.d->a6.c, netmask, 128);
        return std::pair(net, netmask);
    }

    if (netmask > 32)
        return invalid;         // invalid netmask

    // parse the address manually
    auto parts = netStr.split(u'.');
    if (parts.isEmpty() || parts.size() > 4)
        return invalid;         // invalid IPv4 address

    if (parts.constLast().isEmpty())
        parts.removeLast();

    quint32 addr = 0;
    for (int i = 0; i < parts.size(); ++i) {
        bool ok;
        uint byteValue = parts.at(i).toUInt(&ok);
        if (!ok || byteValue > 255)
            return invalid;     // invalid IPv4 address

        addr <<= 8;
        addr += byteValue;
    }
    addr <<= 8 * (4 - parts.size());
    if (netmask == -1) {
        netmask = 8 * parts.size();
    } else if (netmask == 0) {
        // special case here
        // x86's instructions "shr" and "shl" do not operate when
        // their argument is 32, so the code below doesn't work as expected
        addr = 0;
    } else if (netmask != 32) {
        // clear remaining bits
        quint32 mask = quint32(0xffffffff) >> (32 - netmask) << (32 - netmask);
        addr &= mask;
    }

    return std::pair(QHostAddress(addr), netmask);
}